

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkAbsAddToNodeFrames(Vec_Int_t *vNodeFrames,Vec_Int_t *vLevel)

{
  uint Entry;
  int i;
  int i_00;
  Vec_Int_t *pVVar1;
  
  pVVar1 = vLevel;
  for (i_00 = 0; i_00 < vLevel->nSize; i_00 = i_00 + 1) {
    Entry = Vec_IntEntry(vLevel,i_00);
    pVVar1 = (Vec_Int_t *)(ulong)Entry;
    Vec_IntPushUnique(vNodeFrames,Entry);
  }
  Vec_IntSort(vNodeFrames,(int)pVVar1);
  return;
}

Assistant:

void Wlc_NtkAbsAddToNodeFrames( Vec_Int_t * vNodeFrames, Vec_Int_t * vLevel ) 
{
    int i, Entry;
    Vec_IntForEachEntry( vLevel, Entry, i )
        Vec_IntPushUnique( vNodeFrames, Entry );
    Vec_IntSort( vNodeFrames, 0 );
}